

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderWindowOuterBorders(ImGuiWindow *window)

{
  float thickness;
  ImDrawList *pIVar1;
  ImGuiContext *pIVar2;
  ImU32 IVar3;
  int border_n;
  float fVar4;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  ImVec2 local_88;
  float local_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  ImVec2 local_48;
  undefined8 uStack_40;
  ImVec2 local_30;
  
  pIVar2 = GImGui;
  fVar4 = window->WindowRounding;
  thickness = window->WindowBorderSize;
  if ((0.0 < thickness) && ((window->Flags & 0x80) == 0)) {
    pIVar1 = window->DrawList;
    local_88.y = (window->Size).y + (window->Pos).y;
    local_88.x = (window->Size).x + (window->Pos).x;
    IVar3 = GetColorU32(5,1.0);
    ImDrawList::AddRect(pIVar1,&window->Pos,&local_88,IVar3,fVar4,0,thickness);
  }
  border_n = (int)window->ResizeBorderHeld;
  if (border_n != -1) {
    fVar5 = 0.0;
    fVar6 = 0.0;
    IVar7 = GetResizeBorderRect(window,border_n,fVar4,0.0);
    local_58._8_4_ = extraout_XMM0_Dc;
    local_58._0_4_ = IVar7.Min.x;
    local_58._4_4_ = IVar7.Min.y;
    local_58._12_4_ = extraout_XMM0_Dd;
    local_68 = IVar7.Max.x - IVar7.Min.x;
    fStack_64 = IVar7.Max.y - IVar7.Min.y;
    fStack_60 = fVar5 - extraout_XMM0_Dc;
    fStack_5c = fVar6 - extraout_XMM0_Dd;
    local_48 = resize_border_def[border_n].SegmentN2;
    uStack_40 = 0;
    local_78 = fVar4 * resize_border_def[border_n].InnerDir.x;
    fStack_74 = fVar4 * resize_border_def[border_n].InnerDir.y;
    fStack_70 = fVar4 * 0.0;
    fStack_6c = fVar4 * 0.0;
    local_88.x = resize_border_def[border_n].SegmentN1.x * local_68 + IVar7.Min.x + 0.5 + local_78;
    local_88.y = resize_border_def[border_n].SegmentN1.y * fStack_64 + IVar7.Min.y + 0.5 + fStack_74
    ;
    local_7c = resize_border_def[border_n].OuterAngle;
    ImDrawList::PathArcTo(window->DrawList,&local_88,fVar4,local_7c + -0.7853982,local_7c,0);
    local_88.y = local_48.y * fStack_64 + (float)local_58._4_4_ + 0.5 + fStack_74;
    local_88.x = local_48.x * local_68 + (float)local_58._0_4_ + 0.5 + local_78;
    ImDrawList::PathArcTo(window->DrawList,&local_88,fVar4,local_7c,local_7c + 0.7853982,0);
    pIVar1 = window->DrawList;
    IVar3 = GetColorU32(0x1d,1.0);
    fVar4 = 2.0;
    if (2.0 <= thickness) {
      fVar4 = thickness;
    }
    ImDrawList::PathStroke(pIVar1,IVar3,0,fVar4);
  }
  if (((0.0 < (pIVar2->Style).FrameBorderSize) && ((window->Flags & 1) == 0)) &&
     ((window->field_0x3e1 & 1) == 0)) {
    fVar4 = (window->Pos).y;
    fVar5 = ImGuiWindow::TitleBarHeight(window);
    local_30.y = fVar5 + fVar4 + -1.0;
    pIVar1 = window->DrawList;
    fVar4 = (window->Pos).x;
    local_88.y = local_30.y;
    local_88.x = thickness + fVar4;
    local_30.x = (fVar4 + (window->Size).x) - thickness;
    IVar3 = GetColorU32(5,1.0);
    ImDrawList::AddLine(pIVar1,&local_88,&local_30,IVar3,(pIVar2->Style).FrameBorderSize);
  }
  return;
}

Assistant:

static void ImGui::RenderWindowOuterBorders(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    float rounding = window->WindowRounding;
    float border_size = window->WindowBorderSize;
    if (border_size > 0.0f && !(window->Flags & ImGuiWindowFlags_NoBackground))
        window->DrawList->AddRect(window->Pos, window->Pos + window->Size, GetColorU32(ImGuiCol_Border), rounding, 0, border_size);

    int border_held = window->ResizeBorderHeld;
    if (border_held != -1)
    {
        const ImGuiResizeBorderDef& def = resize_border_def[border_held];
        ImRect border_r = GetResizeBorderRect(window, border_held, rounding, 0.0f);
        window->DrawList->PathArcTo(ImLerp(border_r.Min, border_r.Max, def.SegmentN1) + ImVec2(0.5f, 0.5f) + def.InnerDir * rounding, rounding, def.OuterAngle - IM_PI * 0.25f, def.OuterAngle);
        window->DrawList->PathArcTo(ImLerp(border_r.Min, border_r.Max, def.SegmentN2) + ImVec2(0.5f, 0.5f) + def.InnerDir * rounding, rounding, def.OuterAngle, def.OuterAngle + IM_PI * 0.25f);
        window->DrawList->PathStroke(GetColorU32(ImGuiCol_SeparatorActive), 0, ImMax(2.0f, border_size)); // Thicker than usual
    }
    if (g.Style.FrameBorderSize > 0 && !(window->Flags & ImGuiWindowFlags_NoTitleBar) && !window->DockIsActive)
    {
        float y = window->Pos.y + window->TitleBarHeight() - 1;
        window->DrawList->AddLine(ImVec2(window->Pos.x + border_size, y), ImVec2(window->Pos.x + window->Size.x - border_size, y), GetColorU32(ImGuiCol_Border), g.Style.FrameBorderSize);
    }
}